

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm.c
# Opt level: O0

void asm_gcstep(ASMState *as,IRIns *ir)

{
  ulong in_RSI;
  long in_RDI;
  IRIns *ira;
  undefined8 local_18;
  
  for (local_18 = *(long *)(in_RDI + 0x90) + (ulong)(*(int *)(in_RDI + 0xcc) + 1) * 8;
      local_18 < in_RSI; local_18 = local_18 + 8) {
    if (((((*(char *)(local_18 + 5) == 'O') || (*(char *)(local_18 + 5) == 'P')) ||
         (*(char *)(local_18 + 5) == 'Q')) || (*(char *)(local_18 + 5) == 'R')) &&
       (((*(byte *)(local_18 + 6) & 0x80) == 0 || (*(char *)(local_18 + 7) != '\0')))) {
      *(int *)(in_RDI + 0x10c) = *(int *)(in_RDI + 0x10c) + 1;
    }
  }
  if (*(int *)(in_RDI + 0x10c) != 0) {
    asm_gc_check((ASMState *)&ir->field_0);
  }
  *(undefined4 *)(in_RDI + 0x10c) = 0x80000000;
  return;
}

Assistant:

static void asm_gcstep(ASMState *as, IRIns *ir)
{
  IRIns *ira;
  for (ira = IR(as->stopins+1); ira < ir; ira++)
    if ((ira->o == IR_TNEW || ira->o == IR_TDUP ||
	 (LJ_HASFFI && (ira->o == IR_CNEW || ira->o == IR_CNEWI))) &&
	ra_used(ira))
      as->gcsteps++;
  if (as->gcsteps)
    asm_gc_check(as);
  as->gcsteps = 0x80000000;  /* Prevent implicit GC check further up. */
}